

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall Buffer_new_and_free_Test::Buffer_new_and_free_Test(Buffer_new_and_free_Test *this)

{
  Buffer_new_and_free_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Buffer_new_and_free_Test_001ed3b8;
  return;
}

Assistant:

TEST(Buffer, new_and_free) {
    // test that you can create and destroy a buffer on the heap
    auto* buf = bfy_buffer_new();
    EXPECT_NE(nullptr, buf);
    EXPECT_EQ(0, bfy_buffer_get_content_len(buf));
    EXPECT_EQ(0, bfy_buffer_get_space_len(buf));
    bfy_buffer_free(buf);
}